

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestModelFactory.h
# Opt level: O1

aiScene * Assimp::TestModelFacttory::createDefaultTestModel(float *opacity)

{
  bool bVar1;
  int iVar2;
  aiScene *this;
  aiMaterial **ppaVar3;
  aiMaterial *this_00;
  time_t tVar4;
  aiMesh **ppaVar5;
  aiMesh *paVar6;
  aiVector3D *paVar7;
  undefined8 *puVar8;
  uint *puVar9;
  aiNode *this_01;
  char *pcVar10;
  AssertionResult gtest_ar;
  aiColor3D color;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  undefined8 local_3c;
  undefined4 local_34;
  
  this = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this);
  this->mNumMaterials = 1;
  ppaVar3 = (aiMaterial **)operator_new__(8);
  this->mMaterials = ppaVar3;
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  *this->mMaterials = this_00;
  local_3c = 0x3f800000;
  local_34 = 0;
  local_60.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_60.ptr_._4_4_ << 0x20);
  local_58.data_._0_4_ =
       aiMaterial::AddBinaryProperty(*this->mMaterials,&local_3c,0xc,"$clr.diffuse",0,0,aiPTI_Float)
  ;
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            (local_50,"aiReturn_SUCCESS",
             "scene->mMaterials[ 0 ]->AddProperty( &color, 1, \"$clr.diffuse\",0,0 )",
             (aiReturn *)&local_60,(aiReturn *)&local_58);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/TestModelFactory.h"
               ,0x44,pcVar10);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60.ptr_ + 8))();
      }
      local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  iVar2 = rand();
  *opacity = (float)iVar2 * 4.656613e-10;
  local_60.ptr_ = local_60.ptr_ & 0xffffffff00000000;
  local_58.data_._0_4_ =
       aiMaterial::AddBinaryProperty(*this->mMaterials,opacity,4,"$mat.opacity",0,0,aiPTI_Float);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            (local_50,"aiReturn_SUCCESS",
             "scene->mMaterials[ 0 ]->AddProperty( &opacity, 1, \"$mat.opacity\",0,0 )",
             (aiReturn *)&local_60,(aiReturn *)&local_58);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/TestModelFactory.h"
               ,0x48,pcVar10);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60.ptr_ + 8))();
      }
      local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  this->mNumMeshes = 1;
  ppaVar5 = (aiMesh **)operator_new__(8);
  this->mMeshes = ppaVar5;
  paVar6 = (aiMesh *)operator_new(0x520);
  paVar6->mPrimitiveTypes = 0;
  paVar6->mNumVertices = 0;
  paVar6->mNumFaces = 0;
  memset(&paVar6->mVertices,0,0xcc);
  paVar6->mBones = (aiBone **)0x0;
  paVar6->mMaterialIndex = 0;
  (paVar6->mName).length = 0;
  (paVar6->mName).data[0] = '\0';
  memset((paVar6->mName).data + 1,0x1b,0x3ff);
  paVar6->mNumAnimMeshes = 0;
  paVar6->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar6->mMethod = 0;
  (paVar6->mAABB).mMin.x = 0.0;
  (paVar6->mAABB).mMin.y = 0.0;
  (paVar6->mAABB).mMin.z = 0.0;
  (paVar6->mAABB).mMax.x = 0.0;
  (paVar6->mAABB).mMax.y = 0.0;
  (paVar6->mAABB).mMax.z = 0.0;
  paVar6->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar6->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar6->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar6->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar6->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar6->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar6->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar6->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar6->mNumUVComponents[0] = 0;
  paVar6->mNumUVComponents[1] = 0;
  paVar6->mNumUVComponents[2] = 0;
  paVar6->mNumUVComponents[3] = 0;
  paVar6->mNumUVComponents[4] = 0;
  paVar6->mNumUVComponents[5] = 0;
  paVar6->mNumUVComponents[6] = 0;
  paVar6->mNumUVComponents[7] = 0;
  paVar6->mColors[0] = (aiColor4D *)0x0;
  paVar6->mColors[1] = (aiColor4D *)0x0;
  paVar6->mColors[2] = (aiColor4D *)0x0;
  paVar6->mColors[3] = (aiColor4D *)0x0;
  paVar6->mColors[4] = (aiColor4D *)0x0;
  paVar6->mColors[5] = (aiColor4D *)0x0;
  paVar6->mColors[6] = (aiColor4D *)0x0;
  paVar6->mColors[7] = (aiColor4D *)0x0;
  *ppaVar5 = paVar6;
  paVar6->mMaterialIndex = 0;
  paVar6->mPrimitiveTypes = 4;
  paVar6->mNumVertices = 3;
  paVar7 = (aiVector3D *)operator_new__(0x24);
  paVar7->x = 0.0;
  paVar7->y = 0.0;
  *(undefined8 *)&paVar7->z = 0;
  paVar7[1].y = 0.0;
  paVar7[1].z = 0.0;
  paVar7[2].x = 0.0;
  paVar7[2].y = 0.0;
  paVar7[2].z = 0.0;
  paVar6->mVertices = paVar7;
  paVar7->x = 1.0;
  paVar7->y = 0.0;
  *(undefined8 *)&paVar7->z = 0;
  paVar7[1].y = 1.0;
  paVar7[1].z = 0.0;
  paVar7[2].x = 0.0;
  paVar7[2].y = 0.0;
  paVar7[2].z = 1.0;
  paVar6->mNumFaces = 1;
  puVar8 = (undefined8 *)operator_new__(0x18);
  *puVar8 = 1;
  *(undefined4 *)(puVar8 + 1) = 0;
  puVar8[2] = 0;
  (*ppaVar5)->mFaces = (aiFace *)(puVar8 + 1);
  (*this->mMeshes)->mFaces->mNumIndices = 3;
  puVar9 = (uint *)operator_new__(0xc);
  (*this->mMeshes)->mFaces->mIndices = puVar9;
  *(*this->mMeshes)->mFaces->mIndices = 0;
  (*this->mMeshes)->mFaces->mIndices[1] = 1;
  (*this->mMeshes)->mFaces->mIndices[2] = 2;
  this_01 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_01);
  this->mRootNode = this_01;
  this_01->mNumMeshes = 1;
  puVar9 = (uint *)operator_new__(4);
  *puVar9 = 0;
  this_01->mMeshes = puVar9;
  return this;
}

Assistant:

static aiScene *createDefaultTestModel( float &opacity ) {
        aiScene *scene( new aiScene );
        scene->mNumMaterials = 1;
        scene->mMaterials = new aiMaterial*[scene->mNumMaterials];
        scene->mMaterials[ 0 ] = new aiMaterial;
        aiColor3D color( 1, 0, 0 );
        EXPECT_EQ( AI_SUCCESS, scene->mMaterials[ 0 ]->AddProperty( &color, 1, AI_MATKEY_COLOR_DIFFUSE ) );

        ::srand( static_cast< unsigned int >( ::time( NULL ) ) );
        opacity = float( rand() ) / float( RAND_MAX );
        EXPECT_EQ( AI_SUCCESS, scene->mMaterials[ 0 ]->AddProperty( &opacity, 1, AI_MATKEY_OPACITY ) );

        scene->mNumMeshes = 1;
        scene->mMeshes = new aiMesh*[scene->mNumMeshes];
        scene->mMeshes[ 0 ] = new aiMesh;
        scene->mMeshes[ 0 ]->mMaterialIndex = 0;
        scene->mMeshes[ 0 ]->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
        scene->mMeshes[ 0 ]->mNumVertices = 3;
        scene->mMeshes[ 0 ]->mVertices = new aiVector3D[ 3 ];
        scene->mMeshes[ 0 ]->mVertices[ 0 ] = aiVector3D( 1, 0, 0 );
        scene->mMeshes[ 0 ]->mVertices[ 1 ] = aiVector3D( 0, 1, 0 );
        scene->mMeshes[ 0 ]->mVertices[ 2 ] = aiVector3D( 0, 0, 1 );
        scene->mMeshes[ 0 ]->mNumFaces = 1;
        scene->mMeshes[ 0 ]->mFaces = new aiFace[scene->mMeshes[ 0 ]->mNumFaces];
        scene->mMeshes[ 0 ]->mFaces[ 0 ].mNumIndices = 3;
        scene->mMeshes[ 0 ]->mFaces[ 0 ].mIndices = new unsigned int[ 3 ];
        scene->mMeshes[ 0 ]->mFaces[ 0 ].mIndices[ 0 ] = 0;
        scene->mMeshes[ 0 ]->mFaces[ 0 ].mIndices[ 1 ] = 1;
        scene->mMeshes[ 0 ]->mFaces[ 0 ].mIndices[ 2 ] = 2;

        scene->mRootNode = new aiNode();
        scene->mRootNode->mNumMeshes = 1;
        scene->mRootNode->mMeshes = new unsigned int[1]{ 0 };

        return scene;
    }